

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyBlobRelease(SyBlob *pBlob)

{
  sxi32 in_EAX;
  
  if (((pBlob->nFlags & 6) == 0) && (pBlob->mByte != 0)) {
    in_EAX = SyMemBackendFree(pBlob->pAllocator,pBlob->pBlob);
  }
  pBlob->pBlob = (void *)0x0;
  pBlob->nByte = 0;
  pBlob->mByte = 0;
  pBlob->nFlags = 0;
  return in_EAX;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobRelease(SyBlob *pBlob)
{
	if( (pBlob->nFlags & (SXBLOB_STATIC|SXBLOB_RDONLY)) == 0 && pBlob->mByte > 0 ){
		SyMemBackendFree(pBlob->pAllocator, pBlob->pBlob);
	}
	pBlob->pBlob = 0;
	pBlob->nByte = pBlob->mByte = 0;
	pBlob->nFlags = 0;
	return SXRET_OK;
}